

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void VP8LHistogramAddSinglePixOrCopy
               (VP8LHistogram *histo,PixOrCopy *v,_func_int_int_int *distance_modifier,
               int distance_modifier_arg0)

{
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  
  if (v->mode == '\x01') {
    puVar6 = histo->literal_ + (int)(v->argb_or_distance + 0x118);
    goto LAB_00148d3a;
  }
  if (v->mode == '\0') {
    histo->alpha_[*(byte *)((long)&v->argb_or_distance + 3)] =
         histo->alpha_[*(byte *)((long)&v->argb_or_distance + 3)] + 1;
    histo->red_[*(byte *)((long)&v->argb_or_distance + 2)] =
         histo->red_[*(byte *)((long)&v->argb_or_distance + 2)] + 1;
    histo->literal_[*(byte *)((long)&v->argb_or_distance + 1)] =
         histo->literal_[*(byte *)((long)&v->argb_or_distance + 1)] + 1;
    puVar6 = histo->blue_ + (byte)v->argb_or_distance;
    goto LAB_00148d3a;
  }
  uVar1 = v->len;
  if ((ulong)uVar1 < 0x200) {
    uVar3 = (uint)kPrefixEncodeCode[uVar1].code_;
  }
  else {
    uVar5 = uVar1 - 1;
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uint)((uVar5 >> ((byte)(0x1e - (char)(uVar3 ^ 0x1f)) & 0x1f) & 1) != 0) +
            (uVar3 ^ 0x1f) * 2 ^ 0x3e;
  }
  histo->literal_[(long)(int)uVar3 + 0x100] = histo->literal_[(long)(int)uVar3 + 0x100] + 1;
  uVar2 = v->argb_or_distance;
  if (distance_modifier == (_func_int_int_int *)0x0) {
    if (0x1ff < (int)uVar2) {
      uVar5 = uVar2 - 1;
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uint)((uVar5 >> ((byte)(0x1e - (char)(uVar3 ^ 0x1f)) & 0x1f) & 1) != 0) +
              (uVar3 ^ 0x1f) * 2;
      goto LAB_00148d2b;
    }
    uVar3 = (uint)kPrefixEncodeCode[(int)uVar2].code_;
  }
  else {
    iVar4 = (*distance_modifier)(distance_modifier_arg0,uVar2);
    if (iVar4 < 0x200) {
      uVar3 = (uint)kPrefixEncodeCode[iVar4].code_;
    }
    else {
      uVar5 = iVar4 - 1;
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uint)((uVar5 >> ((byte)(0x1e - (char)(uVar3 ^ 0x1f)) & 0x1f) & 1) != 0) +
              (uVar3 ^ 0x1f) * 2;
LAB_00148d2b:
      uVar3 = uVar3 ^ 0x3e;
    }
  }
  puVar6 = histo->distance_ + (int)uVar3;
LAB_00148d3a:
  *puVar6 = *puVar6 + 1;
  return;
}

Assistant:

void VP8LHistogramAddSinglePixOrCopy(VP8LHistogram* const histo,
                                     const PixOrCopy* const v,
                                     int (*const distance_modifier)(int, int),
                                     int distance_modifier_arg0) {
  if (PixOrCopyIsLiteral(v)) {
    ++histo->alpha_[PixOrCopyLiteral(v, 3)];
    ++histo->red_[PixOrCopyLiteral(v, 2)];
    ++histo->literal_[PixOrCopyLiteral(v, 1)];
    ++histo->blue_[PixOrCopyLiteral(v, 0)];
  } else if (PixOrCopyIsCacheIdx(v)) {
    const int literal_ix =
        NUM_LITERAL_CODES + NUM_LENGTH_CODES + PixOrCopyCacheIdx(v);
    assert(histo->palette_code_bits_ != 0);
    ++histo->literal_[literal_ix];
  } else {
    int code, extra_bits;
    VP8LPrefixEncodeBits(PixOrCopyLength(v), &code, &extra_bits);
    ++histo->literal_[NUM_LITERAL_CODES + code];
    if (distance_modifier == NULL) {
      VP8LPrefixEncodeBits(PixOrCopyDistance(v), &code, &extra_bits);
    } else {
      VP8LPrefixEncodeBits(
          distance_modifier(distance_modifier_arg0, PixOrCopyDistance(v)),
          &code, &extra_bits);
    }
    ++histo->distance_[code];
  }
}